

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void rope_yarn(float theta_extrap,float freq_scale,float *corr_dims,int64_t i0,float ext_factor,
              float mscale,float *cos_theta,float *sin_theta)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  undefined1 auVar4 [64];
  undefined1 extraout_var [60];
  
  fVar3 = theta_extrap * freq_scale;
  if ((ext_factor != 0.0) || (NAN(ext_factor))) {
    auVar1 = vmaxss_avx(SUB6416(ZEXT464(0x3a83126f),0),ZEXT416((uint)(corr_dims[1] - *corr_dims)));
    auVar1 = vmaxss_avx(ZEXT816(0) << 0x40,
                        ZEXT416((uint)(((float)((int)(((uint)((ulong)i0 >> 0x1f) & 1) + (int)i0) >>
                                               1) - *corr_dims) / auVar1._0_4_)));
    auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar1);
    fVar2 = (1.0 - auVar1._0_4_) * ext_factor;
    auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * theta_extrap)),ZEXT416((uint)fVar3),
                             ZEXT416((uint)(1.0 - fVar2)));
    fVar3 = auVar1._0_4_;
    auVar4._0_4_ = logf(1.0 / freq_scale);
    auVar4._4_60_ = extraout_var;
    auVar1 = vfmadd132ss_fma(auVar4._0_16_,SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0x3dcccccd));
    mscale = auVar1._0_4_ * mscale;
  }
  fVar2 = cosf(fVar3);
  *cos_theta = fVar2 * mscale;
  fVar3 = sinf(fVar3);
  *sin_theta = fVar3 * mscale;
  return;
}

Assistant:

static void rope_yarn(
    float theta_extrap, float freq_scale, float corr_dims[2], int64_t i0, float ext_factor, float mscale,
    float * cos_theta, float * sin_theta) {
    // Get n-d rotational scaling corrected for extrapolation
    float theta_interp = freq_scale * theta_extrap;
    float theta = theta_interp;
    if (ext_factor != 0.0f) {
        float ramp_mix = rope_yarn_ramp(corr_dims[0], corr_dims[1], i0) * ext_factor;
        theta = theta_interp * (1 - ramp_mix) + theta_extrap * ramp_mix;

        // Get n-d magnitude scaling corrected for interpolation
        mscale *= 1.0f + 0.1f * logf(1.0f / freq_scale);
    }
    *cos_theta = cosf(theta) * mscale;
    *sin_theta = sinf(theta) * mscale;
}